

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bqm.hpp
# Opt level: O3

void BQMTester<cimod::Dense>::test_DenseBQMFunctionTest_empty(void)

{
  char *pcVar1;
  BQM<uint32_t,_double,_cimod::Dense> bqm_b;
  BQM<uint32_t,_double,_cimod::Dense> bqm;
  double offset;
  Quadratic<uint32_t,_double> quadratic;
  Linear<uint32_t,_double> linear;
  BQM<uint32_t,_double,_cimod::Dense> bqm_s;
  AssertHelper local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2a8;
  AssertHelper local_2a0;
  undefined1 local_298 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_290;
  undefined1 local_260 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_258;
  pointer local_248;
  pointer local_238;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_230;
  Vartype local_1f0;
  BinaryQuadraticModel<unsigned_int,_double,_cimod::Dense> local_1e8;
  double local_168;
  _Hashtable<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_cimod::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_160;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_128;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_f0;
  _Hashtable<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_cimod::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_b8;
  BinaryQuadraticModel<unsigned_int,_double,_cimod::Dense> local_80;
  
  local_1e8._quadmat.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
  m_cols = 2;
  local_1e8._idx_to_label.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&DAT_3ff0000000000000;
  local_1e8._quadmat.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
  m_data = (double *)0x1;
  local_1e8._quadmat.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
  m_rows = 0x3ff0000000000000;
  std::
  _Hashtable<unsigned_int,std::pair<unsigned_int_const,double>,std::allocator<std::pair<unsigned_int_const,double>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_Hashtable<std::pair<unsigned_int_const,double>const*>
            ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,double>,std::allocator<std::pair<unsigned_int_const,double>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&local_f0,&local_1e8,
             &local_1e8._idx_to_label.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish,0,&local_80,local_260,&local_160);
  local_1e8._quadmat.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
  m_data = (double *)&DAT_200000001;
  local_1e8._quadmat.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
  m_rows = 0x3ff0000000000000;
  std::
  _Hashtable<std::pair<unsigned_int,unsigned_int>,std::pair<std::pair<unsigned_int,unsigned_int>const,double>,std::allocator<std::pair<std::pair<unsigned_int,unsigned_int>const,double>>,std::__detail::_Select1st,std::equal_to<std::pair<unsigned_int,unsigned_int>>,cimod::pair_hash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_Hashtable<std::pair<std::pair<unsigned_int,unsigned_int>const,double>const*>
            ((_Hashtable<std::pair<unsigned_int,unsigned_int>,std::pair<std::pair<unsigned_int,unsigned_int>const,double>,std::allocator<std::pair<std::pair<unsigned_int,unsigned_int>const,double>>,std::__detail::_Select1st,std::equal_to<std::pair<unsigned_int,unsigned_int>>,cimod::pair_hash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&local_160,&local_1e8,
             &local_1e8._quadmat.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_cols,0,&local_80,local_260,&local_128);
  local_128._M_buckets = &local_128._M_single_bucket;
  local_128._M_bucket_count = 1;
  local_128._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_128._M_element_count = 0;
  local_128._M_rehash_policy._M_max_load_factor = 1.0;
  local_128._M_rehash_policy._4_4_ = 0;
  local_128._M_rehash_policy._M_next_resize = 0;
  local_128._M_single_bucket = (__node_base_ptr)0x0;
  local_b8._M_buckets = &local_b8._M_single_bucket;
  local_b8._M_bucket_count = 1;
  local_b8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_b8._M_element_count = 0;
  local_b8._M_rehash_policy._M_max_load_factor = 1.0;
  local_b8._M_rehash_policy._4_4_ = 0;
  local_b8._M_rehash_policy._M_next_resize = 0;
  local_b8._M_single_bucket = (__node_base_ptr)0x0;
  local_168 = 0.5;
  cimod::BinaryQuadraticModel<unsigned_int,_double,_cimod::Dense>::BinaryQuadraticModel
            (&local_1e8,(Linear<unsigned_int,_double> *)&local_f0,
             (Quadratic<unsigned_int,_double> *)&local_160,&local_168,SPIN);
  cimod::BinaryQuadraticModel<unsigned_int,_double,_cimod::Dense>::empty(&local_80,&local_1e8,SPIN);
  cimod::BinaryQuadraticModel<unsigned_int,_double,_cimod::Dense>::get_linear
            ((Linear<unsigned_int,_double> *)local_260,&local_1e8);
  testing::internal::
  CmpHelperEQ<std::unordered_map<unsigned_int,double,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,double>>>,std::unordered_map<unsigned_int,double,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,double>>>>
            ((internal *)local_298,"bqm.get_linear()","linear",
             (unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>
              *)local_260,
             (unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>
              *)&local_f0);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)local_260);
  if (local_298[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_260);
    if (local_290 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_290->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_2b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
               ,0x1c3,pcVar1);
    testing::internal::AssertHelper::operator=(&local_2b0,(Message *)local_260);
    testing::internal::AssertHelper::~AssertHelper(&local_2b0);
    if ((long *)CONCAT71(local_260._1_7_,local_260[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_260._1_7_,local_260[0]) + 8))();
    }
  }
  if (local_290 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_290,local_290);
  }
  cimod::BinaryQuadraticModel<unsigned_int,_double,_cimod::Dense>::get_quadratic
            ((Quadratic<unsigned_int,_double> *)local_260,&local_1e8);
  testing::internal::
  CmpHelperEQ<std::unordered_map<std::pair<unsigned_int,unsigned_int>,double,cimod::pair_hash,std::equal_to<std::pair<unsigned_int,unsigned_int>>,std::allocator<std::pair<std::pair<unsigned_int,unsigned_int>const,double>>>,std::unordered_map<std::pair<unsigned_int,unsigned_int>,double,cimod::pair_hash,std::equal_to<std::pair<unsigned_int,unsigned_int>>,std::allocator<std::pair<std::pair<unsigned_int,unsigned_int>const,double>>>>
            ((internal *)local_298,"bqm.get_quadratic()","quadratic",
             (unordered_map<std::pair<unsigned_int,_unsigned_int>,_double,_cimod::pair_hash,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>_>_>
              *)local_260,
             (unordered_map<std::pair<unsigned_int,_unsigned_int>,_double,_cimod::pair_hash,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>_>_>
              *)&local_160);
  std::
  _Hashtable<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_cimod::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_cimod::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_260);
  if (local_298[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_260);
    if (local_290 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_290->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_2b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
               ,0x1c4,pcVar1);
    testing::internal::AssertHelper::operator=(&local_2b0,(Message *)local_260);
    testing::internal::AssertHelper::~AssertHelper(&local_2b0);
    if ((long *)CONCAT71(local_260._1_7_,local_260[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_260._1_7_,local_260[0]) + 8))();
    }
  }
  if (local_290 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_290,local_290);
  }
  cimod::BinaryQuadraticModel<unsigned_int,_double,_cimod::Dense>::get_linear
            ((Linear<unsigned_int,_double> *)local_260,&local_80);
  testing::internal::
  CmpHelperEQ<std::unordered_map<unsigned_int,double,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,double>>>,std::unordered_map<unsigned_int,double,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,double>>>>
            ((internal *)local_298,"bqm_s.get_linear()","empty_linear",
             (unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>
              *)local_260,
             (unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>
              *)&local_128);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)local_260);
  if (local_298[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_260);
    if (local_290 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_290->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_2b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
               ,0x1c6,pcVar1);
    testing::internal::AssertHelper::operator=(&local_2b0,(Message *)local_260);
    testing::internal::AssertHelper::~AssertHelper(&local_2b0);
    if ((long *)CONCAT71(local_260._1_7_,local_260[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_260._1_7_,local_260[0]) + 8))();
    }
  }
  if (local_290 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_290,local_290);
  }
  cimod::BinaryQuadraticModel<unsigned_int,_double,_cimod::Dense>::get_quadratic
            ((Quadratic<unsigned_int,_double> *)local_260,&local_80);
  testing::internal::
  CmpHelperEQ<std::unordered_map<std::pair<unsigned_int,unsigned_int>,double,cimod::pair_hash,std::equal_to<std::pair<unsigned_int,unsigned_int>>,std::allocator<std::pair<std::pair<unsigned_int,unsigned_int>const,double>>>,std::unordered_map<std::pair<unsigned_int,unsigned_int>,double,cimod::pair_hash,std::equal_to<std::pair<unsigned_int,unsigned_int>>,std::allocator<std::pair<std::pair<unsigned_int,unsigned_int>const,double>>>>
            ((internal *)local_298,"bqm_s.get_quadratic()","empty_quadratic",
             (unordered_map<std::pair<unsigned_int,_unsigned_int>,_double,_cimod::pair_hash,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>_>_>
              *)local_260,
             (unordered_map<std::pair<unsigned_int,_unsigned_int>,_double,_cimod::pair_hash,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>_>_>
              *)&local_b8);
  std::
  _Hashtable<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_cimod::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_cimod::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_260);
  if (local_298[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_260);
    if (local_290 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_290->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_2b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
               ,0x1c7,pcVar1);
    testing::internal::AssertHelper::operator=(&local_2b0,(Message *)local_260);
    testing::internal::AssertHelper::~AssertHelper(&local_2b0);
    if ((long *)CONCAT71(local_260._1_7_,local_260[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_260._1_7_,local_260[0]) + 8))();
    }
  }
  if (local_290 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_290,local_290);
  }
  local_298._0_4_ = local_80.m_vartype;
  local_2b0.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<cimod::Vartype,cimod::Vartype>
            ((internal *)local_260,"bqm_s.get_vartype()","Vartype::SPIN",(Vartype *)local_298,
             (Vartype *)&local_2b0);
  if (local_260[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_298);
    if (local_258 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_258->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_2b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
               ,0x1c8,pcVar1);
    testing::internal::AssertHelper::operator=(&local_2b0,(Message *)local_298);
    testing::internal::AssertHelper::~AssertHelper(&local_2b0);
    if ((long *)CONCAT44(local_298._4_4_,local_298._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_298._4_4_,local_298._0_4_) + 8))();
    }
  }
  if (local_258 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_258,local_258);
  }
  cimod::BinaryQuadraticModel<unsigned_int,_double,_cimod::Dense>::empty
            ((BinaryQuadraticModel<unsigned_int,_double,_cimod::Dense> *)local_260,&local_1e8,BINARY
            );
  cimod::BinaryQuadraticModel<unsigned_int,_double,_cimod::Dense>::get_linear
            ((Linear<unsigned_int,_double> *)local_298,&local_1e8);
  testing::internal::
  CmpHelperEQ<std::unordered_map<unsigned_int,double,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,double>>>,std::unordered_map<unsigned_int,double,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,double>>>>
            ((internal *)&local_2b0,"bqm.get_linear()","linear",
             (unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>
              *)local_298,
             (unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>
              *)&local_f0);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)local_298);
  if (local_2b0.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_298);
    if (local_2a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_2a8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_2a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
               ,0x1cc,pcVar1);
    testing::internal::AssertHelper::operator=(&local_2a0,(Message *)local_298);
    testing::internal::AssertHelper::~AssertHelper(&local_2a0);
    if ((long *)CONCAT44(local_298._4_4_,local_298._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_298._4_4_,local_298._0_4_) + 8))();
    }
  }
  if (local_2a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_2a8,local_2a8);
  }
  cimod::BinaryQuadraticModel<unsigned_int,_double,_cimod::Dense>::get_quadratic
            ((Quadratic<unsigned_int,_double> *)local_298,&local_1e8);
  testing::internal::
  CmpHelperEQ<std::unordered_map<std::pair<unsigned_int,unsigned_int>,double,cimod::pair_hash,std::equal_to<std::pair<unsigned_int,unsigned_int>>,std::allocator<std::pair<std::pair<unsigned_int,unsigned_int>const,double>>>,std::unordered_map<std::pair<unsigned_int,unsigned_int>,double,cimod::pair_hash,std::equal_to<std::pair<unsigned_int,unsigned_int>>,std::allocator<std::pair<std::pair<unsigned_int,unsigned_int>const,double>>>>
            ((internal *)&local_2b0,"bqm.get_quadratic()","quadratic",
             (unordered_map<std::pair<unsigned_int,_unsigned_int>,_double,_cimod::pair_hash,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>_>_>
              *)local_298,
             (unordered_map<std::pair<unsigned_int,_unsigned_int>,_double,_cimod::pair_hash,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>_>_>
              *)&local_160);
  std::
  _Hashtable<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_cimod::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_cimod::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_298);
  if (local_2b0.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_298);
    if (local_2a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_2a8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_2a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
               ,0x1cd,pcVar1);
    testing::internal::AssertHelper::operator=(&local_2a0,(Message *)local_298);
    testing::internal::AssertHelper::~AssertHelper(&local_2a0);
    if ((long *)CONCAT44(local_298._4_4_,local_298._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_298._4_4_,local_298._0_4_) + 8))();
    }
  }
  if (local_2a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_2a8,local_2a8);
  }
  cimod::BinaryQuadraticModel<unsigned_int,_double,_cimod::Dense>::get_linear
            ((Linear<unsigned_int,_double> *)local_298,
             (BinaryQuadraticModel<unsigned_int,_double,_cimod::Dense> *)local_260);
  testing::internal::
  CmpHelperEQ<std::unordered_map<unsigned_int,double,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,double>>>,std::unordered_map<unsigned_int,double,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,double>>>>
            ((internal *)&local_2b0,"bqm_b.get_linear()","empty_linear",
             (unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>
              *)local_298,
             (unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>
              *)&local_128);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)local_298);
  if (local_2b0.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_298);
    if (local_2a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_2a8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_2a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
               ,0x1cf,pcVar1);
    testing::internal::AssertHelper::operator=(&local_2a0,(Message *)local_298);
    testing::internal::AssertHelper::~AssertHelper(&local_2a0);
    if ((long *)CONCAT44(local_298._4_4_,local_298._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_298._4_4_,local_298._0_4_) + 8))();
    }
  }
  if (local_2a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_2a8,local_2a8);
  }
  cimod::BinaryQuadraticModel<unsigned_int,_double,_cimod::Dense>::get_quadratic
            ((Quadratic<unsigned_int,_double> *)local_298,
             (BinaryQuadraticModel<unsigned_int,_double,_cimod::Dense> *)local_260);
  testing::internal::
  CmpHelperEQ<std::unordered_map<std::pair<unsigned_int,unsigned_int>,double,cimod::pair_hash,std::equal_to<std::pair<unsigned_int,unsigned_int>>,std::allocator<std::pair<std::pair<unsigned_int,unsigned_int>const,double>>>,std::unordered_map<std::pair<unsigned_int,unsigned_int>,double,cimod::pair_hash,std::equal_to<std::pair<unsigned_int,unsigned_int>>,std::allocator<std::pair<std::pair<unsigned_int,unsigned_int>const,double>>>>
            ((internal *)&local_2b0,"bqm_b.get_quadratic()","empty_quadratic",
             (unordered_map<std::pair<unsigned_int,_unsigned_int>,_double,_cimod::pair_hash,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>_>_>
              *)local_298,
             (unordered_map<std::pair<unsigned_int,_unsigned_int>,_double,_cimod::pair_hash,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>_>_>
              *)&local_b8);
  std::
  _Hashtable<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_cimod::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_cimod::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_298);
  if (local_2b0.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_298);
    if (local_2a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_2a8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_2a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
               ,0x1d0,pcVar1);
    testing::internal::AssertHelper::operator=(&local_2a0,(Message *)local_298);
    testing::internal::AssertHelper::~AssertHelper(&local_2a0);
    if ((long *)CONCAT44(local_298._4_4_,local_298._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_298._4_4_,local_298._0_4_) + 8))();
    }
  }
  if (local_2a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_2a8,local_2a8);
  }
  local_2b0.data_._0_4_ = local_1f0;
  local_2a0.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<cimod::Vartype,cimod::Vartype>
            ((internal *)local_298,"bqm_b.get_vartype()","Vartype::BINARY",(Vartype *)&local_2b0,
             (Vartype *)&local_2a0);
  if (local_298[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_2b0);
    if (local_290 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_290->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_2a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
               ,0x1d1,pcVar1);
    testing::internal::AssertHelper::operator=(&local_2a0,(Message *)&local_2b0);
    testing::internal::AssertHelper::~AssertHelper(&local_2a0);
    if ((long *)CONCAT44(local_2b0.data_._4_4_,(Vartype)local_2b0.data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_2b0.data_._4_4_,(Vartype)local_2b0.data_) + 8))();
    }
  }
  if (local_290 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_290,local_290);
  }
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_230);
  if (local_248 != (pointer)0x0) {
    operator_delete(local_248,(long)local_238 - (long)local_248);
  }
  free((void *)CONCAT71(local_260._1_7_,local_260[0]));
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_80._label_to_idx._M_h);
  if (local_80._idx_to_label.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80._idx_to_label.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_80._idx_to_label.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_80._idx_to_label.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  free(local_80._quadmat.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
       m_data);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_1e8._label_to_idx._M_h);
  if (local_1e8._idx_to_label.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1e8._idx_to_label.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1e8._idx_to_label.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1e8._idx_to_label.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  free(local_1e8._quadmat.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage
       .m_data);
  std::
  _Hashtable<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_cimod::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_b8);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_128);
  std::
  _Hashtable<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_cimod::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_160);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_f0);
  return;
}

Assistant:

static void test_DenseBQMFunctionTest_empty()
    {
        Linear<uint32_t, double> linear{ {1, 1.0}, {2, 1.0} };
        Quadratic<uint32_t, double> quadratic{ {std::make_pair(1, 2), 1.0} };

        Linear<uint32_t, double> empty_linear = Linear<uint32_t, double>();
        Quadratic<uint32_t, double> empty_quadratic = Quadratic<uint32_t, double>();


        double offset = 0.5;
        Vartype vartype = Vartype::SPIN;

        BQM<uint32_t, double, DataType> bqm(linear, quadratic, offset, vartype);

        BQM<uint32_t, double, DataType> bqm_s = bqm.empty(Vartype::SPIN);

        EXPECT_EQ(bqm.get_linear(), linear);
        EXPECT_EQ(bqm.get_quadratic(), quadratic);

        EXPECT_EQ(bqm_s.get_linear(), empty_linear);
        EXPECT_EQ(bqm_s.get_quadratic(), empty_quadratic);
        EXPECT_EQ(bqm_s.get_vartype(), Vartype::SPIN);

        BQM<uint32_t, double, DataType> bqm_b = bqm.empty(Vartype::BINARY);

        EXPECT_EQ(bqm.get_linear(), linear);
        EXPECT_EQ(bqm.get_quadratic(), quadratic);

        EXPECT_EQ(bqm_b.get_linear(), empty_linear);
        EXPECT_EQ(bqm_b.get_quadratic(), empty_quadratic);
        EXPECT_EQ(bqm_b.get_vartype(), Vartype::BINARY);

    }